

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sssort.c
# Opt level: O0

void ss_fixdown(sauchar_t *Td,saidx64_t *PA,saidx64_t *SA,saidx64_t i,saidx64_t size)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  saint_t e;
  saint_t d;
  saint_t c;
  saidx64_t v;
  saidx64_t k;
  saidx64_t j;
  saidx64_t size_local;
  saidx64_t i_local;
  saidx64_t *SA_local;
  saidx64_t *PA_local;
  sauchar_t *Td_local;
  
  lVar2 = SA[i];
  bVar1 = Td[PA[lVar2]];
  i_local = i;
  while( true ) {
    k = i_local * 2 + 1;
    if (size <= k) break;
    lVar3 = i_local * 2 + 2;
    d = (uint)Td[PA[SA[k]]];
    if ((uint)Td[PA[SA[k]]] < (uint)Td[PA[SA[lVar3]]]) {
      d = (uint)Td[PA[SA[lVar3]]];
      k = lVar3;
    }
    if ((uint)d <= (uint)bVar1) break;
    SA[i_local] = SA[k];
    i_local = k;
  }
  SA[i_local] = lVar2;
  return;
}

Assistant:

static INLINE
void
ss_fixdown(const sauchar_t *Td, const saidx_t *PA,
           saidx_t *SA, saidx_t i, saidx_t size) {
  saidx_t j, k;
  saidx_t v;
  saint_t c, d, e;

  for(v = SA[i], c = Td[PA[v]]; (j = 2 * i + 1) < size; SA[i] = SA[k], i = k) {
    d = Td[PA[SA[k = j++]]];
    if(d < (e = Td[PA[SA[j]]])) { k = j; d = e; }
    if(d <= c) { break; }
  }
  SA[i] = v;
}